

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

bool tcu::anon_unknown_3::verifySinglesampleLineGroupRasterization
               (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log)

{
  allocator<tcu::Vector<float,_4>_> *this;
  float fVar1;
  undefined4 uVar2;
  undefined4 y_00;
  deInt32 dVar3;
  byte bVar4;
  RasterizationArguments *lines;
  bool bVar5;
  int iVar6;
  int iVar7;
  size_type sVar8;
  reference pvVar9;
  float *pfVar10;
  long lVar11;
  int *piVar12;
  MessageBuilder *pMVar13;
  TestLog *pTVar14;
  reference rVar15;
  bool local_291a;
  byte local_288a;
  byte local_2726;
  byte local_2725;
  FragmentPacket *local_26d0;
  allocator<char> local_2649;
  string local_2648;
  allocator<char> local_2621;
  string local_2620;
  LogImage local_2600;
  allocator<char> local_2569;
  string local_2568;
  allocator<char> local_2541;
  string local_2540;
  LogImageSet local_2520;
  MessageBuilder local_24e0;
  MessageBuilder local_2360;
  int local_21e0;
  int local_21dc;
  MessageBuilder local_21d8;
  reference local_2058;
  PixelBufferAccess local_2048;
  undefined1 local_201c [24];
  int nearbyID_1;
  int dx_2;
  int dy_2;
  RGBA RStack_1ff8;
  bool multipleNearbyLines_1;
  int lineID_1;
  undefined1 local_1fed;
  int local_1fec;
  int iStack_1fe8;
  bool result_2;
  int y_3;
  int currentWidth_1;
  int currentLine_1;
  undefined1 local_1fd8 [2];
  bool previousPixelUndefined_1;
  bool fullyVisibleLine_1;
  int x_3;
  int local_1e58;
  int local_1e54;
  MessageBuilder local_1e50;
  reference local_1cd0;
  PixelBufferAccess local_1cc0;
  undefined1 local_1c94 [24];
  int nearbyID;
  int dx_1;
  int dy_1;
  RGBA RStack_1c70;
  bool multipleNearbyLines;
  int lineID;
  undefined1 local_1c65;
  int local_1c64;
  int iStack_1c60;
  bool result_1;
  int x_2;
  int currentWidth;
  int currentLine;
  undefined1 local_1c50 [2];
  bool previousPixelUndefined;
  bool fullyVisibleLine;
  int y_2;
  byte local_1ac9;
  undefined1 local_1ac8 [7];
  bool invalidWidthFound;
  MessageBuilder local_1948;
  allocator<char> local_17c1;
  string local_17c0;
  allocator<char> local_1799;
  string local_1798;
  LogImage local_1778;
  allocator<char> local_16e1;
  string local_16e0;
  allocator<char> local_16b9;
  string local_16b8;
  LogImage local_1698;
  allocator<char> local_1601;
  string local_1600;
  allocator<char> local_15d9;
  string local_15d8;
  LogImageSet local_15b8;
  MessageBuilder local_1578;
  deUint32 local_13f4;
  PixelBufferAccess local_13f0;
  undefined1 local_13c8 [24];
  int x_1;
  int y_1;
  PixelBufferAccess local_13a0;
  undefined1 local_1378 [8];
  Surface reference_1;
  int local_11dc;
  undefined1 local_11d8 [4];
  int allowedDeviation;
  allocator<char> local_1051;
  string local_1050;
  allocator<char> local_1029;
  string local_1028;
  LogImage local_1008;
  allocator<char> local_f71;
  string local_f70;
  allocator<char> local_f49;
  string local_f48;
  LogImage local_f28;
  allocator<char> local_e91;
  string local_e90;
  allocator<char> local_e69;
  string local_e68;
  LogImageSet local_e48;
  MessageBuilder local_e08;
  deUint32 local_c84;
  RGBA local_c80;
  RGBA local_c7c;
  int local_c78;
  int local_c74;
  int dx;
  int dy;
  RGBA RStack_c68;
  bool foundFragment;
  undefined1 local_c61;
  undefined1 local_c60 [7];
  bool result;
  undefined1 local_c34 [27];
  bool reference;
  int x;
  int y;
  Vector<int,_4> local_a98;
  PixelBufferAccess local_a88;
  byte local_a59;
  undefined1 local_a58 [7];
  bool missingFragments;
  Surface errorMask;
  PixelBufferAccess local_a30;
  PixelBufferAccess local_a08;
  undefined1 local_9e0 [24];
  Vector<int,_2> local_9c8;
  IVec2 fragPos;
  int fragNdx;
  int packetNdx;
  FragmentPacket packets [32];
  int local_1b0 [2];
  int numRasterized;
  int maxPackets;
  _Bit_type local_1a0;
  Vector<float,_4> local_194;
  Vector<float,_4> local_184;
  Vector<int,_4> local_174;
  undefined1 local_164 [8];
  SingleSampleLineRasterizer rasterizer;
  int lineNdx;
  Vector<int,_4> local_108;
  PixelBufferAccess local_f8;
  TextureFormat local_d0;
  undefined1 local_c8 [8];
  TextureLevel referenceLineMap;
  undefined1 local_98 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> screenspaceLines;
  allocator<bool> local_69;
  undefined1 local_68 [8];
  vector<bool,_std::allocator<bool>_> lineIsXMajor;
  deInt32 local_38;
  int iStack_34;
  bool imageShown;
  int lineWidth;
  int resultFragments;
  int referenceFragments;
  bool overdrawInReference;
  bool allOK;
  TestLog *log_local;
  RasterizationArguments *args_local;
  LineSceneSpec *scene_local;
  Surface *surface_local;
  
  resultFragments._3_1_ = 1;
  resultFragments._2_1_ = 0;
  lineWidth = 0;
  iStack_34 = 0;
  _referenceFragments = log;
  log_local = (TestLog *)args;
  args_local = (RasterizationArguments *)scene;
  scene_local = (LineSceneSpec *)surface;
  local_38 = deFloorFloatToInt32(scene->lineWidth + 0.5);
  lineIsXMajor.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  sVar8 = std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
          ::size((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                  *)args_local);
  std::allocator<bool>::allocator(&local_69);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_68,sVar8,&local_69);
  std::allocator<bool>::~allocator(&local_69);
  sVar8 = std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
          ::size((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                  *)args_local);
  this = (allocator<tcu::Vector<float,_4>_> *)((long)&referenceLineMap.m_data.m_cap + 7);
  std::allocator<tcu::Vector<float,_4>_>::allocator(this);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_98,
             sVar8,this);
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&referenceLineMap.m_data.m_cap + 7));
  TextureFormat::TextureFormat(&local_d0,R,UNSIGNED_INT8);
  iVar6 = Surface::getWidth((Surface *)scene_local);
  iVar7 = Surface::getHeight((Surface *)scene_local);
  TextureLevel::TextureLevel((TextureLevel *)local_c8,&local_d0,iVar6,iVar7,1);
  TextureLevel::getAccess(&local_f8,(TextureLevel *)local_c8);
  Vector<int,_4>::Vector(&local_108,0,0,0,0);
  tcu::clear(&local_f8,&local_108);
  lines = args_local;
  iVar6 = Surface::getWidth((Surface *)scene_local);
  iVar7 = Surface::getHeight((Surface *)scene_local);
  Vector<int,_2>::Vector((Vector<int,_2> *)&rasterizer.m_lineWidth,iVar6,iVar7);
  genScreenSpaceLines((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_98,(vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                *)lines,(IVec2 *)&rasterizer.m_lineWidth);
  rasterizer.m_curRowFragment = 0;
  while( true ) {
    dVar3 = rasterizer.m_curRowFragment;
    sVar8 = std::
            vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
            size((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                  *)args_local);
    if ((int)sVar8 <= dVar3) break;
    iVar6 = Surface::getWidth((Surface *)scene_local);
    iVar7 = Surface::getHeight((Surface *)scene_local);
    Vector<int,_4>::Vector(&local_174,0,0,iVar6,iVar7);
    rr::SingleSampleLineRasterizer::SingleSampleLineRasterizer
              ((SingleSampleLineRasterizer *)local_164,&local_174);
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_98,(long)rasterizer.m_curRowFragment);
    pfVar10 = Vector<float,_4>::operator[](pvVar9,0);
    fVar1 = *pfVar10;
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_98,(long)rasterizer.m_curRowFragment);
    pfVar10 = Vector<float,_4>::operator[](pvVar9,1);
    Vector<float,_4>::Vector(&local_184,fVar1,*pfVar10,0.0,1.0);
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_98,(long)rasterizer.m_curRowFragment);
    pfVar10 = Vector<float,_4>::operator[](pvVar9,2);
    fVar1 = *pfVar10;
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_98,(long)rasterizer.m_curRowFragment);
    pfVar10 = Vector<float,_4>::operator[](pvVar9,3);
    Vector<float,_4>::Vector(&local_194,fVar1,*pfVar10,0.0,1.0);
    rr::SingleSampleLineRasterizer::init
              ((SingleSampleLineRasterizer *)local_164,(EVP_PKEY_CTX *)&local_184);
    pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_98,(long)rasterizer.m_curRowFragment);
    bVar5 = isPackedSSLineXMajor(pvVar9);
    rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_68,
                        (long)rasterizer.m_curRowFragment);
    _numRasterized = rVar15;
    std::_Bit_reference::operator=((_Bit_reference *)&numRasterized,bVar5);
    do {
      local_1b0[1] = 0x20;
      local_1b0[0] = 0;
      local_26d0 = (FragmentPacket *)&fragNdx;
      do {
        rr::FragmentPacket::FragmentPacket(local_26d0);
        local_26d0 = local_26d0 + 1;
      } while (local_26d0 != (FragmentPacket *)(packets[0x1f].barycentric[2].m_data + 2));
      rr::SingleSampleLineRasterizer::rasterize
                ((SingleSampleLineRasterizer *)local_164,(FragmentPacket *)&fragNdx,(float *)0x0,
                 0x20,local_1b0);
      for (fragPos.m_data[1] = 0; fragPos.m_data[1] < local_1b0[0];
          fragPos.m_data[1] = fragPos.m_data[1] + 1) {
        for (fragPos.m_data[0] = 0; fragPos.m_data[0] < 4; fragPos.m_data[0] = fragPos.m_data[0] + 1
            ) {
          if (((uint)*(undefined8 *)packets[fragPos.m_data[1]].position.m_data &
              1 << ((byte)fragPos.m_data[0] & 0x1f)) != 0) {
            lVar11 = (long)fragPos.m_data[1];
            Vector<int,_2>::Vector
                      ((Vector<int,_2> *)(local_9e0 + 0x10),fragPos.m_data[0] % 2,
                       fragPos.m_data[0] / 2);
            tcu::operator+((tcu *)&local_9c8,(Vector<int,_2> *)(&fragNdx + lVar11 * 0x10),
                           (Vector<int,_2> *)(local_9e0 + 0x10));
            if ((resultFragments._2_1_ & 1) == 0) {
              TextureLevel::getAccess(&local_a08,(TextureLevel *)local_c8);
              iVar6 = Vector<int,_2>::x(&local_9c8);
              iVar7 = Vector<int,_2>::y(&local_9c8);
              ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_9e0,(int)&local_a08,iVar6,iVar7);
              piVar12 = Vector<int,_4>::x((Vector<int,_4> *)local_9e0);
              resultFragments._2_1_ = *piVar12 != 0;
            }
            TextureLevel::getAccess(&local_a30,(TextureLevel *)local_c8);
            Vector<int,_4>::Vector
                      ((Vector<int,_4> *)&errorMask.m_pixels.m_cap,rasterizer.m_curRowFragment + 1,0
                       ,0,0);
            iVar6 = Vector<int,_2>::x(&local_9c8);
            iVar7 = Vector<int,_2>::y(&local_9c8);
            PixelBufferAccess::setPixel(&local_a30,(IVec4 *)&errorMask.m_pixels.m_cap,iVar6,iVar7,0)
            ;
          }
        }
      }
    } while (local_1b0[0] == 0x20);
    rr::SingleSampleLineRasterizer::~SingleSampleLineRasterizer
              ((SingleSampleLineRasterizer *)local_164);
    rasterizer.m_curRowFragment = rasterizer.m_curRowFragment + 1;
  }
  iVar6 = Surface::getWidth((Surface *)scene_local);
  iVar7 = Surface::getHeight((Surface *)scene_local);
  Surface::Surface((Surface *)local_a58,iVar6,iVar7);
  local_a59 = 0;
  Surface::getAccess(&local_a88,(Surface *)local_a58);
  Vector<int,_4>::Vector(&local_a98,0,0xff,0,0xff);
  tcu::clear(&local_a88,&local_a98);
  TestLog::operator<<((MessageBuilder *)&x,_referenceFragments,
                      (BeginMessageToken *)&TestLog::Message);
  pMVar13 = MessageBuilder::operator<<
                      ((MessageBuilder *)&x,(char (*) [35])"Searching for deviating fragments.");
  MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&TestLog::EndMessage);
  MessageBuilder::~MessageBuilder((MessageBuilder *)&x);
  stack0xfffffffffffff3e4 = 0;
  do {
    iVar6 = stack0xfffffffffffff3e4;
    iVar7 = TextureLevel::getHeight((TextureLevel *)local_c8);
    if (iVar7 <= iVar6) {
      if ((local_a59 & 1) == 0) {
        TestLog::operator<<((MessageBuilder *)local_11d8,_referenceFragments,
                            (BeginMessageToken *)&TestLog::Message);
        pMVar13 = MessageBuilder::operator<<
                            ((MessageBuilder *)local_11d8,
                             (char (*) [29])"No invalid deviations found.");
        MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&TestLog::EndMessage);
        MessageBuilder::~MessageBuilder((MessageBuilder *)local_11d8);
      }
      else {
        TestLog::operator<<(&local_e08,_referenceFragments,(BeginMessageToken *)&TestLog::Message);
        pMVar13 = MessageBuilder::operator<<
                            (&local_e08,(char (*) [28])"Invalid deviation(s) found.");
        MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&TestLog::EndMessage);
        MessageBuilder::~MessageBuilder(&local_e08);
        pTVar14 = _referenceFragments;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e68,"Verification result",&local_e69);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e90,"Result of rendering",&local_e91);
        LogImageSet::LogImageSet(&local_e48,&local_e68,&local_e90);
        pTVar14 = TestLog::operator<<(pTVar14,&local_e48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f48,"Result",&local_f49)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f70,"Result",&local_f71)
        ;
        LogImage::LogImage(&local_f28,&local_f48,&local_f70,(Surface *)scene_local,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar14 = TestLog::operator<<(pTVar14,&local_f28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1028,"ErrorMask",&local_1029);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1050,"ErrorMask",&local_1051);
        LogImage::LogImage(&local_1008,&local_1028,&local_1050,(Surface *)local_a58,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar14 = TestLog::operator<<(pTVar14,&local_1008);
        TestLog::operator<<(pTVar14,(EndImageSetToken *)&TestLog::EndImageSet);
        LogImage::~LogImage(&local_1008);
        std::__cxx11::string::~string((string *)&local_1050);
        std::allocator<char>::~allocator(&local_1051);
        std::__cxx11::string::~string((string *)&local_1028);
        std::allocator<char>::~allocator(&local_1029);
        LogImage::~LogImage(&local_f28);
        std::__cxx11::string::~string((string *)&local_f70);
        std::allocator<char>::~allocator(&local_f71);
        std::__cxx11::string::~string((string *)&local_f48);
        std::allocator<char>::~allocator(&local_f49);
        LogImageSet::~LogImageSet(&local_e48);
        std::__cxx11::string::~string((string *)&local_e90);
        std::allocator<char>::~allocator(&local_e91);
        std::__cxx11::string::~string((string *)&local_e68);
        std::allocator<char>::~allocator(&local_e69);
        lineIsXMajor.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._7_1_ = 1;
        resultFragments._3_1_ = 0;
      }
      Surface::~Surface((Surface *)local_a58);
      if ((resultFragments._2_1_ & 1) == 0) {
        sVar8 = std::
                vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                ::size((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                        *)args_local);
        local_11dc = (int)sVar8 * local_38;
        TestLog::operator<<((MessageBuilder *)&reference_1.m_pixels.m_cap,_referenceFragments,
                            (BeginMessageToken *)&TestLog::Message);
        pMVar13 = MessageBuilder::operator<<
                            ((MessageBuilder *)&reference_1.m_pixels.m_cap,
                             (char (*) [28])"Verifying fragment counts:\n");
        pMVar13 = MessageBuilder::operator<<(pMVar13,(char (*) [21])"\tDiamond-exit rule: ");
        pMVar13 = MessageBuilder::operator<<(pMVar13,&lineWidth);
        pMVar13 = MessageBuilder::operator<<(pMVar13,(char (*) [13])" fragments.\n");
        pMVar13 = MessageBuilder::operator<<(pMVar13,(char (*) [16])"\tResult image: ");
        pMVar13 = MessageBuilder::operator<<(pMVar13,&stack0xffffffffffffffcc);
        pMVar13 = MessageBuilder::operator<<(pMVar13,(char (*) [13])" fragments.\n");
        pMVar13 = MessageBuilder::operator<<(pMVar13,(char (*) [24])"\tAllowing deviation of ");
        pMVar13 = MessageBuilder::operator<<(pMVar13,&local_11dc);
        pMVar13 = MessageBuilder::operator<<(pMVar13,(char (*) [13])" fragments.\n");
        MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&TestLog::EndMessage);
        MessageBuilder::~MessageBuilder((MessageBuilder *)&reference_1.m_pixels.m_cap);
        iVar6 = deAbs32(lineWidth - iStack_34);
        if (local_11dc < iVar6) {
          iVar6 = Surface::getWidth((Surface *)scene_local);
          iVar7 = Surface::getHeight((Surface *)scene_local);
          Surface::Surface((Surface *)local_1378,iVar6,iVar7);
          Surface::getAccess(&local_13a0,(Surface *)local_1378);
          Vector<int,_4>::Vector((Vector<int,_4> *)&x_1,0,0,0,0xff);
          tcu::clear(&local_13a0,(IVec4 *)&x_1);
          local_13c8._20_4_ = 0;
          while( true ) {
            uVar2 = local_13c8._20_4_;
            iVar6 = Surface::getHeight((Surface *)scene_local);
            if (iVar6 <= (int)uVar2) break;
            local_13c8._16_4_ = 0;
            while( true ) {
              uVar2 = local_13c8._16_4_;
              iVar6 = Surface::getWidth((Surface *)scene_local);
              if (iVar6 <= (int)uVar2) break;
              TextureLevel::getAccess(&local_13f0,(TextureLevel *)local_c8);
              ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_13c8,(int)&local_13f0,local_13c8._16_4_,
                         local_13c8._20_4_);
              piVar12 = Vector<int,_4>::x((Vector<int,_4> *)local_13c8);
              y_00 = local_13c8._20_4_;
              uVar2 = local_13c8._16_4_;
              if (*piVar12 != 0) {
                local_13f4 = (deUint32)RGBA::white();
                Surface::setPixel((Surface *)local_1378,uVar2,y_00,(RGBA)local_13f4);
              }
              local_13c8._16_4_ = local_13c8._16_4_ + 1;
            }
            local_13c8._20_4_ = local_13c8._20_4_ + 1;
          }
          TestLog::operator<<(&local_1578,_referenceFragments,(BeginMessageToken *)&TestLog::Message
                             );
          pMVar13 = MessageBuilder::operator<<
                              (&local_1578,(char (*) [40])"Invalid fragment count in result image.")
          ;
          MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&TestLog::EndMessage);
          MessageBuilder::~MessageBuilder(&local_1578);
          pTVar14 = _referenceFragments;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_15d8,"Verification result",&local_15d9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1600,"Result of rendering",&local_1601);
          LogImageSet::LogImageSet(&local_15b8,&local_15d8,&local_1600);
          pTVar14 = TestLog::operator<<(pTVar14,&local_15b8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_16b8,"Reference",&local_16b9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_16e0,"Reference",&local_16e1);
          LogImage::LogImage(&local_1698,&local_16b8,&local_16e0,(Surface *)local_1378,
                             QP_IMAGE_COMPRESSION_MODE_BEST);
          pTVar14 = TestLog::operator<<(pTVar14,&local_1698);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1798,"Result",&local_1799);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_17c0,"Result",&local_17c1);
          LogImage::LogImage(&local_1778,&local_1798,&local_17c0,(Surface *)scene_local,
                             QP_IMAGE_COMPRESSION_MODE_BEST);
          pTVar14 = TestLog::operator<<(pTVar14,&local_1778);
          TestLog::operator<<(pTVar14,(EndImageSetToken *)&TestLog::EndImageSet);
          LogImage::~LogImage(&local_1778);
          std::__cxx11::string::~string((string *)&local_17c0);
          std::allocator<char>::~allocator(&local_17c1);
          std::__cxx11::string::~string((string *)&local_1798);
          std::allocator<char>::~allocator(&local_1799);
          LogImage::~LogImage(&local_1698);
          std::__cxx11::string::~string((string *)&local_16e0);
          std::allocator<char>::~allocator(&local_16e1);
          std::__cxx11::string::~string((string *)&local_16b8);
          std::allocator<char>::~allocator(&local_16b9);
          LogImageSet::~LogImageSet(&local_15b8);
          std::__cxx11::string::~string((string *)&local_1600);
          std::allocator<char>::~allocator(&local_1601);
          std::__cxx11::string::~string((string *)&local_15d8);
          std::allocator<char>::~allocator(&local_15d9);
          resultFragments._3_1_ = 0;
          lineIsXMajor.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage._7_1_ = 1;
          Surface::~Surface((Surface *)local_1378);
        }
        else {
          TestLog::operator<<(&local_1948,_referenceFragments,(BeginMessageToken *)&TestLog::Message
                             );
          pMVar13 = MessageBuilder::operator<<
                              (&local_1948,(char (*) [25])"Fragment count is valid.");
          MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&TestLog::EndMessage);
          MessageBuilder::~MessageBuilder(&local_1948);
        }
      }
      else {
        TestLog::operator<<((MessageBuilder *)local_1ac8,_referenceFragments,
                            (BeginMessageToken *)&TestLog::Message);
        pMVar13 = MessageBuilder::operator<<
                            ((MessageBuilder *)local_1ac8,
                             (char (*) [86])
                             "Overdraw in scene. Fragment count cannot be verified. Skipping fragment count checks."
                            );
        MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&TestLog::EndMessage);
        MessageBuilder::~MessageBuilder((MessageBuilder *)local_1ac8);
      }
      local_1ac9 = 0;
      TestLog::operator<<((MessageBuilder *)local_1c50,_referenceFragments,
                          (BeginMessageToken *)&TestLog::Message);
      pMVar13 = MessageBuilder::operator<<
                          ((MessageBuilder *)local_1c50,
                           (char (*) [44])"Verifying line widths of the x-major lines.");
      MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&TestLog::EndMessage);
      MessageBuilder::~MessageBuilder((MessageBuilder *)local_1c50);
      currentLine = 1;
      do {
        iVar6 = currentLine;
        iVar7 = TextureLevel::getHeight((TextureLevel *)local_c8);
        if (iVar7 + -1 <= iVar6) {
          TestLog::operator<<((MessageBuilder *)local_1fd8,_referenceFragments,
                              (BeginMessageToken *)&TestLog::Message);
          pMVar13 = MessageBuilder::operator<<
                              ((MessageBuilder *)local_1fd8,
                               (char (*) [44])"Verifying line widths of the y-major lines.");
          MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&TestLog::EndMessage);
          MessageBuilder::~MessageBuilder((MessageBuilder *)local_1fd8);
          currentLine_1 = 1;
          do {
            iVar6 = currentLine_1;
            iVar7 = TextureLevel::getWidth((TextureLevel *)local_c8);
            if (iVar7 + -1 <= iVar6) {
              if ((local_1ac9 & 1) == 0) {
                TestLog::operator<<(&local_24e0,_referenceFragments,
                                    (BeginMessageToken *)&TestLog::Message);
                pMVar13 = MessageBuilder::operator<<
                                    (&local_24e0,(char (*) [23])"Line widths are valid.");
                MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&TestLog::EndMessage);
                MessageBuilder::~MessageBuilder(&local_24e0);
              }
              else {
                TestLog::operator<<(&local_2360,_referenceFragments,
                                    (BeginMessageToken *)&TestLog::Message);
                pMVar13 = MessageBuilder::operator<<
                                    (&local_2360,
                                     (char (*) [46])"Invalid line width found, image is not valid.")
                ;
                MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&TestLog::EndMessage);
                MessageBuilder::~MessageBuilder(&local_2360);
                resultFragments._3_1_ = 0;
              }
              pTVar14 = _referenceFragments;
              if ((lineIsXMajor.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2540,"Verification result",&local_2541);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2568,"Result of rendering",&local_2569);
                LogImageSet::LogImageSet(&local_2520,&local_2540,&local_2568);
                pTVar14 = TestLog::operator<<(pTVar14,&local_2520);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2620,"Result",&local_2621);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2648,"Result",&local_2649);
                LogImage::LogImage(&local_2600,&local_2620,&local_2648,(Surface *)scene_local,
                                   QP_IMAGE_COMPRESSION_MODE_BEST);
                pTVar14 = TestLog::operator<<(pTVar14,&local_2600);
                TestLog::operator<<(pTVar14,(EndImageSetToken *)&TestLog::EndImageSet);
                LogImage::~LogImage(&local_2600);
                std::__cxx11::string::~string((string *)&local_2648);
                std::allocator<char>::~allocator(&local_2649);
                std::__cxx11::string::~string((string *)&local_2620);
                std::allocator<char>::~allocator(&local_2621);
                LogImageSet::~LogImageSet(&local_2520);
                std::__cxx11::string::~string((string *)&local_2568);
                std::allocator<char>::~allocator(&local_2569);
                std::__cxx11::string::~string((string *)&local_2540);
                std::allocator<char>::~allocator(&local_2541);
              }
              bVar4 = resultFragments._3_1_;
              TextureLevel::~TextureLevel((TextureLevel *)local_c8);
              std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                        ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_98);
              std::vector<bool,_std::allocator<bool>_>::~vector
                        ((vector<bool,_std::allocator<bool>_> *)local_68);
              return (bool)(bVar4 & 1);
            }
            currentWidth_1._3_1_ = 0;
            currentWidth_1._2_1_ = 0;
            y_3 = 0;
            iStack_1fe8 = 1;
            local_1fec = 1;
            while( true ) {
              iVar6 = local_1fec;
              iVar7 = TextureLevel::getHeight((TextureLevel *)local_c8);
              if (iVar7 + -1 <= iVar6) break;
              lineID_1 = (int)Surface::getPixel((Surface *)scene_local,currentLine_1,local_1fec);
              RStack_1ff8 = RGBA::white();
              local_1fed = compareColors((RGBA *)&lineID_1,&stack0xffffffffffffe008,
                                         *(int *)&log_local[1].m_log,
                                         *(int *)((long)&log_local[1].m_log + 4),
                                         *(int *)&log_local[2].m_log);
              dy_2 = 0;
              if ((bool)local_1fed) {
                dx_2._3_1_ = 0;
                for (nearbyID_1 = -1; nearbyID_1 < 2; nearbyID_1 = nearbyID_1 + 1) {
                  for (local_201c._20_4_ = -1; (int)local_201c._20_4_ < 2;
                      local_201c._20_4_ = local_201c._20_4_ + 1) {
                    TextureLevel::getAccess(&local_2048,(TextureLevel *)local_c8);
                    ConstPixelBufferAccess::getPixelInt
                              ((ConstPixelBufferAccess *)local_201c,(int)&local_2048,
                               currentLine_1 + local_201c._20_4_,local_1fec + nearbyID_1);
                    piVar12 = Vector<int,_4>::x((Vector<int,_4> *)local_201c);
                    local_201c._16_4_ = *piVar12;
                    iVar6 = dy_2;
                    if (((local_201c._16_4_ != 0) && (iVar6 = local_201c._16_4_, dy_2 != 0)) &&
                       (iVar6 = local_201c._16_4_, dy_2 != local_201c._16_4_)) {
                      dx_2._3_1_ = 1;
                      iVar6 = local_201c._16_4_;
                    }
                    dy_2 = iVar6;
                  }
                }
                if ((dx_2._3_1_ & 1) == 0) goto LAB_00ecf034;
                currentWidth_1._2_1_ = 1;
              }
              else {
LAB_00ecf034:
                if ((currentWidth_1._2_1_ & 1) == 0) {
                  if (dy_2 == y_3) {
                    iStack_1fe8 = iStack_1fe8 + 1;
                  }
                  else {
                    if (y_3 < dy_2) {
                      currentWidth_1._3_1_ = 1;
                    }
                    else {
                      local_291a = false;
                      if ((currentWidth_1._3_1_ & 1) != 0) {
                        rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                           ((vector<bool,_std::allocator<bool>_> *)local_68,
                                            (long)(y_3 + -1));
                        local_2058 = rVar15;
                        local_291a = std::_Bit_reference::operator_cast_to_bool(&local_2058);
                      }
                      if ((local_291a != false) && (iStack_1fe8 != local_38)) {
                        TestLog::operator<<(&local_21d8,_referenceFragments,
                                            (BeginMessageToken *)&TestLog::Message);
                        pMVar13 = MessageBuilder::operator<<
                                            (&local_21d8,(char (*) [25])"\tInvalid line width at (")
                        ;
                        pMVar13 = MessageBuilder::operator<<(pMVar13,&currentLine_1);
                        pMVar13 = MessageBuilder::operator<<(pMVar13,(char (*) [3])0xf95514);
                        local_21dc = local_1fec - iStack_1fe8;
                        pMVar13 = MessageBuilder::operator<<(pMVar13,&local_21dc);
                        pMVar13 = MessageBuilder::operator<<(pMVar13,(char (*) [6])") - (");
                        pMVar13 = MessageBuilder::operator<<(pMVar13,&currentLine_1);
                        pMVar13 = MessageBuilder::operator<<(pMVar13,(char (*) [3])0xf95514);
                        local_21e0 = local_1fec + -1;
                        pMVar13 = MessageBuilder::operator<<(pMVar13,&local_21e0);
                        pMVar13 = MessageBuilder::operator<<
                                            (pMVar13,(char (*) [22])"). Detected width of ");
                        pMVar13 = MessageBuilder::operator<<(pMVar13,&stack0xffffffffffffe018);
                        pMVar13 = MessageBuilder::operator<<(pMVar13,(char (*) [12])0xf4afd9);
                        pMVar13 = MessageBuilder::operator<<(pMVar13,&local_38);
                        MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&TestLog::EndMessage);
                        MessageBuilder::~MessageBuilder(&local_21d8);
                        local_1ac9 = 1;
                      }
                      currentWidth_1._3_1_ = 0;
                    }
                    iStack_1fe8 = 1;
                    y_3 = dy_2;
                  }
                }
                else {
                  y_3 = dy_2;
                  iStack_1fe8 = 1;
                  currentWidth_1._3_1_ = 0;
                  currentWidth_1._2_1_ = 0;
                }
              }
              local_1fec = local_1fec + 1;
            }
            currentLine_1 = currentLine_1 + 1;
          } while( true );
        }
        currentWidth._3_1_ = 0;
        currentWidth._2_1_ = 0;
        x_2 = 0;
        iStack_1c60 = 1;
        local_1c64 = 1;
        while( true ) {
          iVar6 = local_1c64;
          iVar7 = TextureLevel::getWidth((TextureLevel *)local_c8);
          if (iVar7 + -1 <= iVar6) break;
          lineID = (int)Surface::getPixel((Surface *)scene_local,local_1c64,currentLine);
          RStack_1c70 = RGBA::white();
          local_1c65 = compareColors((RGBA *)&lineID,&stack0xffffffffffffe390,
                                     *(int *)&log_local[1].m_log,
                                     *(int *)((long)&log_local[1].m_log + 4),
                                     *(int *)&log_local[2].m_log);
          dy_1 = 0;
          if ((bool)local_1c65) {
            dx_1._3_1_ = 0;
            for (nearbyID = -1; nearbyID < 2; nearbyID = nearbyID + 1) {
              for (local_1c94._20_4_ = -1; (int)local_1c94._20_4_ < 2;
                  local_1c94._20_4_ = local_1c94._20_4_ + 1) {
                TextureLevel::getAccess(&local_1cc0,(TextureLevel *)local_c8);
                ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_1c94,(int)&local_1cc0,
                           local_1c64 + local_1c94._20_4_,currentLine + nearbyID);
                piVar12 = Vector<int,_4>::x((Vector<int,_4> *)local_1c94);
                local_1c94._16_4_ = *piVar12;
                iVar6 = dy_1;
                if (((local_1c94._16_4_ != 0) && (iVar6 = local_1c94._16_4_, dy_1 != 0)) &&
                   (iVar6 = local_1c94._16_4_, dy_1 != local_1c94._16_4_)) {
                  dx_1._3_1_ = 1;
                  iVar6 = local_1c94._16_4_;
                }
                dy_1 = iVar6;
              }
            }
            if ((dx_1._3_1_ & 1) == 0) goto LAB_00ecea76;
            currentWidth._2_1_ = 1;
          }
          else {
LAB_00ecea76:
            if ((currentWidth._2_1_ & 1) == 0) {
              if (dy_1 == x_2) {
                iStack_1c60 = iStack_1c60 + 1;
              }
              else {
                if (x_2 < dy_1) {
                  currentWidth._3_1_ = 1;
                }
                else {
                  local_288a = 0;
                  if ((currentWidth._3_1_ & 1) != 0) {
                    rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                       ((vector<bool,_std::allocator<bool>_> *)local_68,
                                        (long)(x_2 + -1));
                    local_1cd0 = rVar15;
                    bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_1cd0);
                    local_288a = bVar5 ^ 0xff;
                  }
                  if (((local_288a & 1) != 0) && (iStack_1c60 != local_38)) {
                    TestLog::operator<<(&local_1e50,_referenceFragments,
                                        (BeginMessageToken *)&TestLog::Message);
                    pMVar13 = MessageBuilder::operator<<
                                        (&local_1e50,(char (*) [25])"\tInvalid line width at (");
                    local_1e54 = local_1c64 - iStack_1c60;
                    pMVar13 = MessageBuilder::operator<<(pMVar13,&local_1e54);
                    pMVar13 = MessageBuilder::operator<<(pMVar13,(char (*) [3])0xf95514);
                    pMVar13 = MessageBuilder::operator<<(pMVar13,&currentLine);
                    pMVar13 = MessageBuilder::operator<<(pMVar13,(char (*) [6])") - (");
                    local_1e58 = local_1c64 + -1;
                    pMVar13 = MessageBuilder::operator<<(pMVar13,&local_1e58);
                    pMVar13 = MessageBuilder::operator<<(pMVar13,(char (*) [3])0xf95514);
                    pMVar13 = MessageBuilder::operator<<(pMVar13,&currentLine);
                    pMVar13 = MessageBuilder::operator<<
                                        (pMVar13,(char (*) [22])"). Detected width of ");
                    pMVar13 = MessageBuilder::operator<<(pMVar13,&stack0xffffffffffffe3a0);
                    pMVar13 = MessageBuilder::operator<<(pMVar13,(char (*) [12])0xf4afd9);
                    pMVar13 = MessageBuilder::operator<<(pMVar13,&local_38);
                    MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&TestLog::EndMessage);
                    MessageBuilder::~MessageBuilder(&local_1e50);
                    local_1ac9 = 1;
                  }
                  currentWidth._3_1_ = 0;
                }
                iStack_1c60 = 1;
                x_2 = dy_1;
              }
            }
            else {
              x_2 = dy_1;
              iStack_1c60 = 1;
              currentWidth._3_1_ = 0;
              currentWidth._2_1_ = 0;
            }
          }
          local_1c64 = local_1c64 + 1;
        }
        currentLine = currentLine + 1;
      } while( true );
    }
    local_c34._20_4_ = 0;
    while( true ) {
      uVar2 = local_c34._20_4_;
      iVar6 = TextureLevel::getWidth((TextureLevel *)local_c8);
      if (iVar6 <= (int)uVar2) break;
      TextureLevel::getAccess((PixelBufferAccess *)local_c60,(TextureLevel *)local_c8);
      ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_c34,(int)local_c60,local_c34._20_4_,
                 stack0xfffffffffffff3e4);
      piVar12 = Vector<int,_4>::x((Vector<int,_4> *)local_c34);
      local_c34[0x13] = *piVar12 != 0;
      RStack_c68 = Surface::getPixel((Surface *)scene_local,local_c34._20_4_,stack0xfffffffffffff3e4
                                    );
      dy = (int)RGBA::white();
      local_c61 = compareColors(&stack0xfffffffffffff398,(RGBA *)&dy,*(int *)&log_local[1].m_log,
                                *(int *)((long)&log_local[1].m_log + 4),*(int *)&log_local[2].m_log)
      ;
      uVar2 = local_c34._20_4_;
      if ((local_c34[0x13] & 1) != 0) {
        lineWidth = lineWidth + 1;
      }
      if ((bool)local_c61) {
        iStack_34 = iStack_34 + 1;
      }
      if ((((local_c34[0x13] & 1) != local_c61) && ((local_c34[0x13] & 1) != 0)) &&
         (!(bool)local_c61)) {
        dx._3_1_ = 0;
        if ((local_c34._20_4_ == 0) || (stack0xfffffffffffff3e4 == 0)) {
LAB_00ecd7e2:
          dx._3_1_ = 1;
        }
        else {
          iVar7 = TextureLevel::getWidth((TextureLevel *)local_c8);
          iVar6 = stack0xfffffffffffff3e4;
          if (uVar2 == iVar7 + -1) goto LAB_00ecd7e2;
          iVar7 = TextureLevel::getHeight((TextureLevel *)local_c8);
          if (iVar6 == iVar7 + -1) goto LAB_00ecd7e2;
        }
        local_c74 = -1;
        while( true ) {
          iVar6 = stack0xfffffffffffff3e4;
          uVar2 = local_c34._20_4_;
          local_2725 = 0;
          if (local_c74 < 2) {
            local_2725 = dx._3_1_ ^ 0xff;
          }
          if ((local_2725 & 1) == 0) break;
          local_c78 = -1;
          while( true ) {
            local_2726 = 0;
            if (local_c78 < 2) {
              local_2726 = dx._3_1_ ^ 0xff;
            }
            if ((local_2726 & 1) == 0) break;
            local_c7c = Surface::getPixel((Surface *)scene_local,local_c34._20_4_ + local_c78,
                                          stack0xfffffffffffff3e4 + local_c74);
            local_c80 = RGBA::white();
            bVar5 = compareColors(&local_c7c,&local_c80,*(int *)&log_local[1].m_log,
                                  *(int *)((long)&log_local[1].m_log + 4),
                                  *(int *)&log_local[2].m_log);
            if (bVar5) {
              dx._3_1_ = 1;
            }
            local_c78 = local_c78 + 1;
          }
          local_c74 = local_c74 + 1;
        }
        if ((dx._3_1_ & 1) == 0) {
          local_a59 = 1;
          local_c84 = (deUint32)RGBA::red();
          Surface::setPixel((Surface *)local_a58,uVar2,iVar6,(RGBA)local_c84);
        }
      }
      local_c34._20_4_ = local_c34._20_4_ + 1;
    }
    register0x00000000 = stack0xfffffffffffff3e4 + 1;
  } while( true );
}

Assistant:

bool verifySinglesampleLineGroupRasterization (const tcu::Surface& surface, const LineSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log)
{
	DE_ASSERT(deFloatFrac(scene.lineWidth) != 0.5f); // rounding direction is not defined, disallow undefined cases
	DE_ASSERT(scene.lines.size() < 255); // indices are stored as unsigned 8-bit ints

	bool					allOK				= true;
	bool					overdrawInReference	= false;
	int						referenceFragments	= 0;
	int						resultFragments		= 0;
	int						lineWidth			= deFloorFloatToInt32(scene.lineWidth + 0.5f);
	bool					imageShown			= false;
	std::vector<bool>		lineIsXMajor		(scene.lines.size());
	std::vector<tcu::Vec4>	screenspaceLines(scene.lines.size());

	// Reference renderer produces correct fragments using the diamond-rule. Make 2D int array, each cell contains the highest index (first index = 1) of the overlapping lines or 0 if no line intersects the pixel
	tcu::TextureLevel referenceLineMap(tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT8), surface.getWidth(), surface.getHeight());
	tcu::clear(referenceLineMap.getAccess(), tcu::IVec4(0, 0, 0, 0));

	genScreenSpaceLines(screenspaceLines, scene.lines, tcu::IVec2(surface.getWidth(), surface.getHeight()));

	for (int lineNdx = 0; lineNdx < (int)scene.lines.size(); ++lineNdx)
	{
		rr::SingleSampleLineRasterizer rasterizer(tcu::IVec4(0, 0, surface.getWidth(), surface.getHeight()));
		rasterizer.init(tcu::Vec4(screenspaceLines[lineNdx][0],
								  screenspaceLines[lineNdx][1],
								  0.0f,
								  1.0f),
						tcu::Vec4(screenspaceLines[lineNdx][2],
								  screenspaceLines[lineNdx][3],
								  0.0f,
								  1.0f),
						scene.lineWidth);

		// calculate majority of later use
		lineIsXMajor[lineNdx] = isPackedSSLineXMajor(screenspaceLines[lineNdx]);

		for (;;)
		{
			const int			maxPackets			= 32;
			int					numRasterized		= 0;
			rr::FragmentPacket	packets[maxPackets];

			rasterizer.rasterize(packets, DE_NULL, maxPackets, numRasterized);

			for (int packetNdx = 0; packetNdx < numRasterized; ++packetNdx)
			{
				for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				{
					if ((deUint32)packets[packetNdx].coverage & (1 << fragNdx))
					{
						const tcu::IVec2 fragPos = packets[packetNdx].position + tcu::IVec2(fragNdx%2, fragNdx/2);

						// Check for overdraw
						if (!overdrawInReference)
							overdrawInReference = referenceLineMap.getAccess().getPixelInt(fragPos.x(), fragPos.y()).x() != 0;

						// Output pixel
						referenceLineMap.getAccess().setPixel(tcu::IVec4(lineNdx + 1, 0, 0, 0), fragPos.x(), fragPos.y());
					}
				}
			}

			if (numRasterized != maxPackets)
				break;
		}
	}

	// Requirement 1: The coordinates of a fragment produced by the algorithm may not deviate by more than one unit
	{
		tcu::Surface	errorMask			(surface.getWidth(), surface.getHeight());
		bool			missingFragments	= false;

		tcu::clear(errorMask.getAccess(), tcu::IVec4(0, 255, 0, 255));

		log << tcu::TestLog::Message << "Searching for deviating fragments." << tcu::TestLog::EndMessage;

		for (int y = 0; y < referenceLineMap.getHeight(); ++y)
		for (int x = 0; x < referenceLineMap.getWidth(); ++x)
		{
			const bool reference	= referenceLineMap.getAccess().getPixelInt(x, y).x() != 0;
			const bool result		= compareColors(surface.getPixel(x, y), tcu::RGBA::white(), args.redBits, args.greenBits, args.blueBits);

			if (reference)
				++referenceFragments;
			if (result)
				++resultFragments;

			if (reference == result)
				continue;

			// Reference fragment here, matching result fragment must be nearby
			if (reference && !result)
			{
				bool foundFragment = false;

				if (x == 0 || y == 0 || x == referenceLineMap.getWidth() - 1 || y == referenceLineMap.getHeight() -1)
				{
					// image boundary, missing fragment could be over the image edge
					foundFragment = true;
				}

				// find nearby fragment
				for (int dy = -1; dy < 2 && !foundFragment; ++dy)
				for (int dx = -1; dx < 2 && !foundFragment; ++dx)
				{
					if (compareColors(surface.getPixel(x+dx, y+dy), tcu::RGBA::white(), args.redBits, args.greenBits, args.blueBits))
						foundFragment = true;
				}

				if (!foundFragment)
				{
					missingFragments = true;
					errorMask.setPixel(x, y, tcu::RGBA::red());
				}
			}
		}

		if (missingFragments)
		{
			log << tcu::TestLog::Message << "Invalid deviation(s) found." << tcu::TestLog::EndMessage;
			log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
				<< tcu::TestLog::Image("Result", "Result",			surface)
				<< tcu::TestLog::Image("ErrorMask", "ErrorMask",	errorMask)
				<< tcu::TestLog::EndImageSet;

			imageShown = true;
			allOK = false;
		}
		else
		{
			log << tcu::TestLog::Message << "No invalid deviations found." << tcu::TestLog::EndMessage;
		}
	}

	// Requirement 2: The total number of fragments produced by the algorithm may differ from
	//                that produced by the diamond-exit rule by no more than one.
	{
		// Check is not valid if the primitives intersect or otherwise share same fragments
		if (!overdrawInReference)
		{
			int allowedDeviation = (int)scene.lines.size() * lineWidth; // one pixel per primitive in the major direction

			log << tcu::TestLog::Message << "Verifying fragment counts:\n"
				<< "\tDiamond-exit rule: " << referenceFragments << " fragments.\n"
				<< "\tResult image: " << resultFragments << " fragments.\n"
				<< "\tAllowing deviation of " << allowedDeviation << " fragments.\n"
				<< tcu::TestLog::EndMessage;

			if (deAbs32(referenceFragments - resultFragments) > allowedDeviation)
			{
				tcu::Surface reference(surface.getWidth(), surface.getHeight());

				// show a helpful reference image
				tcu::clear(reference.getAccess(), tcu::IVec4(0, 0, 0, 255));
				for (int y = 0; y < surface.getHeight(); ++y)
				for (int x = 0; x < surface.getWidth(); ++x)
					if (referenceLineMap.getAccess().getPixelInt(x, y).x())
						reference.setPixel(x, y, tcu::RGBA::white());

				log << tcu::TestLog::Message << "Invalid fragment count in result image." << tcu::TestLog::EndMessage;
				log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
					<< tcu::TestLog::Image("Reference", "Reference",	reference)
					<< tcu::TestLog::Image("Result", "Result",			surface)
					<< tcu::TestLog::EndImageSet;

				allOK = false;
				imageShown = true;
			}
			else
			{
				log << tcu::TestLog::Message << "Fragment count is valid." << tcu::TestLog::EndMessage;
			}
		}
		else
		{
			log << tcu::TestLog::Message << "Overdraw in scene. Fragment count cannot be verified. Skipping fragment count checks." << tcu::TestLog::EndMessage;
		}
	}

	// Requirement 3: Line width must be constant
	{
		bool invalidWidthFound = false;

		log << tcu::TestLog::Message << "Verifying line widths of the x-major lines." << tcu::TestLog::EndMessage;
		for (int y = 1; y < referenceLineMap.getHeight() - 1; ++y)
		{
			bool	fullyVisibleLine		= false;
			bool	previousPixelUndefined	= false;
			int		currentLine				= 0;
			int		currentWidth			= 1;

			for (int x = 1; x < referenceLineMap.getWidth() - 1; ++x)
			{
				const bool	result	= compareColors(surface.getPixel(x, y), tcu::RGBA::white(), args.redBits, args.greenBits, args.blueBits);
				int			lineID	= 0;

				// Which line does this fragment belong to?

				if (result)
				{
					bool multipleNearbyLines = false;

					for (int dy = -1; dy < 2; ++dy)
					for (int dx = -1; dx < 2; ++dx)
					{
						const int nearbyID = referenceLineMap.getAccess().getPixelInt(x+dx, y+dy).x();
						if (nearbyID)
						{
							if (lineID && lineID != nearbyID)
								multipleNearbyLines = true;
							lineID = nearbyID;
						}
					}

					if (multipleNearbyLines)
					{
						// Another line is too close, don't try to calculate width here
						previousPixelUndefined = true;
						continue;
					}
				}

				// Only line with id of lineID is nearby

				if (previousPixelUndefined)
				{
					// The line might have been overdrawn or not
					currentLine = lineID;
					currentWidth = 1;
					fullyVisibleLine = false;
					previousPixelUndefined = false;
				}
				else if (lineID == currentLine)
				{
					// Current line continues
					++currentWidth;
				}
				else if (lineID > currentLine)
				{
					// Another line was drawn over or the line ends
					currentLine = lineID;
					currentWidth = 1;
					fullyVisibleLine = true;
				}
				else
				{
					// The line ends
					if (fullyVisibleLine && !lineIsXMajor[currentLine-1])
					{
						// check width
						if (currentWidth != lineWidth)
						{
							log << tcu::TestLog::Message << "\tInvalid line width at (" << x - currentWidth << ", " << y << ") - (" << x - 1 << ", " << y << "). Detected width of " << currentWidth << ", expected " << lineWidth << tcu::TestLog::EndMessage;
							invalidWidthFound = true;
						}
					}

					currentLine = lineID;
					currentWidth = 1;
					fullyVisibleLine = false;
				}
			}
		}

		log << tcu::TestLog::Message << "Verifying line widths of the y-major lines." << tcu::TestLog::EndMessage;
		for (int x = 1; x < referenceLineMap.getWidth() - 1; ++x)
		{
			bool	fullyVisibleLine		= false;
			bool	previousPixelUndefined	= false;
			int		currentLine				= 0;
			int		currentWidth			= 1;

			for (int y = 1; y < referenceLineMap.getHeight() - 1; ++y)
			{
				const bool	result	= compareColors(surface.getPixel(x, y), tcu::RGBA::white(), args.redBits, args.greenBits, args.blueBits);
				int			lineID	= 0;

				// Which line does this fragment belong to?

				if (result)
				{
					bool multipleNearbyLines = false;

					for (int dy = -1; dy < 2; ++dy)
					for (int dx = -1; dx < 2; ++dx)
					{
						const int nearbyID = referenceLineMap.getAccess().getPixelInt(x+dx, y+dy).x();
						if (nearbyID)
						{
							if (lineID && lineID != nearbyID)
								multipleNearbyLines = true;
							lineID = nearbyID;
						}
					}

					if (multipleNearbyLines)
					{
						// Another line is too close, don't try to calculate width here
						previousPixelUndefined = true;
						continue;
					}
				}

				// Only line with id of lineID is nearby

				if (previousPixelUndefined)
				{
					// The line might have been overdrawn or not
					currentLine = lineID;
					currentWidth = 1;
					fullyVisibleLine = false;
					previousPixelUndefined = false;
				}
				else if (lineID == currentLine)
				{
					// Current line continues
					++currentWidth;
				}
				else if (lineID > currentLine)
				{
					// Another line was drawn over or the line ends
					currentLine = lineID;
					currentWidth = 1;
					fullyVisibleLine = true;
				}
				else
				{
					// The line ends
					if (fullyVisibleLine && lineIsXMajor[currentLine-1])
					{
						// check width
						if (currentWidth != lineWidth)
						{
							log << tcu::TestLog::Message << "\tInvalid line width at (" << x << ", " << y - currentWidth << ") - (" << x  << ", " << y - 1 << "). Detected width of " << currentWidth << ", expected " << lineWidth << tcu::TestLog::EndMessage;
							invalidWidthFound = true;
						}
					}

					currentLine = lineID;
					currentWidth = 1;
					fullyVisibleLine = false;
				}
			}
		}

		if (invalidWidthFound)
		{
			log << tcu::TestLog::Message << "Invalid line width found, image is not valid." << tcu::TestLog::EndMessage;
			allOK = false;
		}
		else
		{
			log << tcu::TestLog::Message << "Line widths are valid." << tcu::TestLog::EndMessage;
		}
	}

	//\todo [2013-10-24 jarkko].
	//Requirement 4. If two line segments share a common endpoint, and both segments are either
	//x-major (both left-to-right or both right-to-left) or y-major (both bottom-totop
	//or both top-to-bottom), then rasterizing both segments may not produce
	//duplicate fragments, nor may any fragments be omitted so as to interrupt
	//continuity of the connected segments.

	if (!imageShown)
	{
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result", surface)
			<< tcu::TestLog::EndImageSet;
	}

	return allOK;
}